

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::setActivePanelHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool duringActivationEvent)

{
  bool bVar1;
  Int IVar2;
  FocusPolicy FVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  QGraphicsScenePrivate *this_00;
  QGraphicsScenePrivate *pQVar6;
  QGraphicsItem *pQVar7;
  QGraphicsWidgetPrivate *pQVar8;
  const_iterator o;
  byte in_DL;
  long in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item_2;
  QList<QGraphicsItem_*> *__range3_1;
  QGraphicsWidget *fw;
  QGraphicsItem *focusItem;
  QGraphicsItem *item_1;
  QList<QGraphicsItem_*> *__range3;
  QGraphicsItem *fi;
  QGraphicsItem *oldFocusItem;
  QGraphicsItem *panel;
  QGraphicsScene *q;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  QEvent event_4;
  QList<QGraphicsItem_*> items_1;
  QEvent event_3;
  QEvent event;
  const_iterator __end3;
  const_iterator __begin3;
  QEvent event_2;
  QList<QGraphicsItem_*> items;
  QEvent event_1;
  char *in_stack_fffffffffffffe68;
  GraphicsItemFlag other;
  QGraphicsWidget *in_stack_fffffffffffffe70;
  QGraphicsItem *in_stack_fffffffffffffe78;
  FocusReason _t3;
  QGraphicsItem *in_stack_fffffffffffffe80;
  QGraphicsItem *in_stack_fffffffffffffe88;
  QGraphicsItem *in_stack_fffffffffffffe90;
  QGraphicsWidget *item_00;
  QGraphicsScenePrivate *in_stack_fffffffffffffe98;
  QGraphicsItem *local_160;
  QGraphicsWidget *local_158;
  QGraphicsWidget *local_138;
  const_iterator local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_a0;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_9c;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QGraphicsItem **local_78;
  const_iterator local_70;
  const_iterator local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = &q_func(in_RDI)->super_QObject;
  if ((in_RSI == 0) ||
     (pQVar5 = &QGraphicsItem::scene((QGraphicsItem *)0x9c5189)->super_QObject, pQVar5 == pQVar4)) {
    QGraphicsScene::setFocus
              ((QGraphicsScene *)in_stack_fffffffffffffe80,
               (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    if (in_RSI == 0) {
      local_158 = (QGraphicsWidget *)0x0;
    }
    else {
      local_158 = (QGraphicsWidget *)QGraphicsItem::panel(in_stack_fffffffffffffe78);
    }
    if (local_158 == (QGraphicsWidget *)0x0) {
      local_160 = (QGraphicsItem *)0x0;
    }
    else {
      local_160 = in_RDI->activePanel;
    }
    in_RDI->lastActivePanel = local_160;
    if (local_158 != (QGraphicsWidget *)in_RDI->activePanel) {
      bVar1 = QGraphicsScene::isActive((QGraphicsScene *)in_stack_fffffffffffffe70);
      other = (GraphicsItemFlag)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if ((bVar1) || ((in_DL & 1) != 0)) {
        if (in_RDI->activePanel == (QGraphicsItem *)0x0) {
          if ((local_158 != (QGraphicsWidget *)0x0) && ((in_DL & 1) == 0)) {
            local_50 = &DAT_aaaaaaaaaaaaaaaa;
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            QGraphicsScene::items
                      ((QGraphicsScene *)in_stack_fffffffffffffe88,
                       (SortOrder)((ulong)in_stack_fffffffffffffe80 >> 0x20));
            local_60 = &DAT_aaaaaaaaaaaaaaaa;
            local_58 = &DAT_aaaaaaaaaaaaaaaa;
            QEvent::QEvent((QEvent *)&local_60,WindowDeactivate);
            local_68.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_68 = QList<QGraphicsItem_*>::begin
                                 ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe70);
            local_70.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_70 = QList<QGraphicsItem_*>::end
                                 ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe70);
            while( true ) {
              local_78 = local_70.i;
              bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_68,local_70);
              other = (GraphicsItemFlag)((ulong)in_stack_fffffffffffffe68 >> 0x20);
              if (!bVar1) break;
              QList<QGraphicsItem_*>::const_iterator::operator*(&local_68);
              bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9c549f);
              if (((bVar1) && (bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c54af), !bVar1))
                 && (pQVar7 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c54bd),
                    pQVar7 == (QGraphicsItem *)0x0)) {
                QGraphicsScene::sendEvent
                          ((QGraphicsScene *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                           (QEvent *)in_stack_fffffffffffffe80);
              }
              QList<QGraphicsItem_*>::const_iterator::operator++(&local_68);
            }
            QEvent::~QEvent((QEvent *)&local_60);
            QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c550b);
          }
        }
        else {
          this_00 = (QGraphicsScenePrivate *)QGraphicsItem::focusItem((QGraphicsItem *)0x9c52af);
          if ((this_00 != (QGraphicsScenePrivate *)0x0) &&
             (pQVar6 = (QGraphicsScenePrivate *)
                       QGraphicsScene::focusItem((QGraphicsScene *)in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe98 = this_00, this_00 == pQVar6)) {
            setFocusItemHelper(this_00,in_stack_fffffffffffffe90,
                               (FocusReason)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
            in_stack_fffffffffffffe98 = this_00;
          }
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          QEvent::QEvent((QEvent *)&local_38,WindowDeactivate);
          QGraphicsScene::sendEvent
                    ((QGraphicsScene *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (QEvent *)in_stack_fffffffffffffe80);
          QEvent::~QEvent((QEvent *)&local_38);
        }
        in_RDI->activePanel = (QGraphicsItem *)local_158;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_88,ActivationChange);
        QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_88);
        if (local_158 == (QGraphicsWidget *)0x0) {
          bVar1 = QGraphicsScene::isActive((QGraphicsScene *)in_stack_fffffffffffffe70);
          _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
          if (bVar1) {
            local_b8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            QGraphicsScene::items
                      ((QGraphicsScene *)in_stack_fffffffffffffe88,
                       (SortOrder)((ulong)in_stack_fffffffffffffe80 >> 0x20));
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            local_c0 = &DAT_aaaaaaaaaaaaaaaa;
            QEvent::QEvent((QEvent *)&local_c8,WindowActivate);
            local_d0.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_d0 = QList<QGraphicsItem_*>::begin
                                 ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe70);
            o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe70);
            while( true ) {
              bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_d0,o);
              _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
              if (!bVar1) break;
              QList<QGraphicsItem_*>::const_iterator::operator*(&local_d0);
              bVar1 = QGraphicsItem::isVisible((QGraphicsItem *)0x9c5894);
              if (((bVar1) && (bVar1 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c58a4), !bVar1))
                 && (pQVar7 = QGraphicsItem::parentItem((QGraphicsItem *)0x9c58b2),
                    pQVar7 == (QGraphicsItem *)0x0)) {
                QGraphicsScene::sendEvent
                          ((QGraphicsScene *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                           (QEvent *)in_stack_fffffffffffffe80);
              }
              QList<QGraphicsItem_*>::const_iterator::operator++(&local_d0);
            }
            QEvent::~QEvent((QEvent *)&local_c8);
            QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c5900);
          }
        }
        else {
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          local_90 = &DAT_aaaaaaaaaaaaaaaa;
          QEvent::QEvent((QEvent *)&local_98,WindowActivate);
          QGraphicsScene::sendEvent
                    ((QGraphicsScene *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (QEvent *)in_stack_fffffffffffffe80);
          pQVar7 = QGraphicsItem::focusItem((QGraphicsItem *)0x9c55cf);
          _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
          if (pQVar7 == (QGraphicsItem *)0x0) {
            local_a0.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 QGraphicsItem::flags((QGraphicsItem *)in_stack_fffffffffffffe70);
            local_9c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
                 (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
                 QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                           ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffffe70,
                            other);
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_9c);
            _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
            if (IVar2 == 0) {
              bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0x9c5661);
              _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
              if (bVar1) {
                if (local_158 == (QGraphicsWidget *)0x0) {
                  in_stack_fffffffffffffe88 = (QGraphicsItem *)0x0;
                }
                else {
                  in_stack_fffffffffffffe88 =
                       (QGraphicsItem *)&local_158[-1].super_QGraphicsLayoutItem;
                }
                item_00 = local_158;
                pQVar8 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9c56a0);
                local_138 = pQVar8->focusNext;
                do {
                  FVar3 = QGraphicsWidget::focusPolicy(in_stack_fffffffffffffe70);
                  if ((FVar3 & TabFocus) != NoFocus) {
                    in_stack_fffffffffffffe80 = (QGraphicsItem *)0x0;
                    if (local_138 != (QGraphicsWidget *)0x0) {
                      in_stack_fffffffffffffe80 =
                           &(local_138->super_QGraphicsObject).super_QGraphicsItem;
                    }
                    setFocusItemHelper(in_stack_fffffffffffffe98,(QGraphicsItem *)item_00,
                                       (FocusReason)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                                       SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
                    _t3 = (FocusReason)((ulong)local_138 >> 0x20);
                    break;
                  }
                  pQVar8 = QGraphicsWidget::d_func((QGraphicsWidget *)0x9c5705);
                  _t3 = (FocusReason)((ulong)in_stack_fffffffffffffe78 >> 0x20);
                  local_138 = pQVar8->focusNext;
                  in_stack_fffffffffffffe70 = (QGraphicsWidget *)0x0;
                  if (local_138 != (QGraphicsWidget *)0x0) {
                    in_stack_fffffffffffffe70 =
                         (QGraphicsWidget *)&(local_138->super_QGraphicsObject).super_QGraphicsItem;
                  }
                } while (in_stack_fffffffffffffe70 != local_158);
              }
            }
            else {
              setFocusItemHelper(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                 (FocusReason)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
            }
          }
          else {
            setFocusItemHelper(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                               (FocusReason)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
          }
          QEvent::~QEvent((QEvent *)&local_98);
        }
        QGraphicsScene::focusItemChanged
                  ((QGraphicsScene *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe80,_t3);
        QEvent::~QEvent((QEvent *)&local_88);
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
               (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),in_stack_fffffffffffffe68);
    QMessageLogger::warning
              (local_28,"QGraphicsScene::setActivePanel: item %p must be part of this scene",in_RSI)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setActivePanelHelper(QGraphicsItem *item, bool duringActivationEvent)
{
    Q_Q(QGraphicsScene);
    if (item && item->scene() != q) {
        qWarning("QGraphicsScene::setActivePanel: item %p must be part of this scene",
                 item);
        return;
    }

    // Ensure the scene has focus when we change panel activation.
    q->setFocus(Qt::ActiveWindowFocusReason);

    // Find the item's panel.
    QGraphicsItem *panel = item ? item->panel() : nullptr;
    lastActivePanel = panel ? activePanel : nullptr;
    if (panel == activePanel || (!q->isActive() && !duringActivationEvent))
        return;

    QGraphicsItem *oldFocusItem = focusItem;

    // Deactivate the last active panel.
    if (activePanel) {
        if (QGraphicsItem *fi = activePanel->focusItem()) {
            // Remove focus from the current focus item.
            if (fi == q->focusItem())
                setFocusItemHelper(nullptr, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        }

        QEvent event(QEvent::WindowDeactivate);
        q->sendEvent(activePanel, &event);
    } else if (panel && !duringActivationEvent) {
        // Deactivate the scene if changing activation to a panel.
        const auto items = q->items();
        QEvent event(QEvent::WindowDeactivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    // Update activate state.
    activePanel = panel;
    QEvent event(QEvent::ActivationChange);
    QCoreApplication::sendEvent(q, &event);

    // Activate
    if (panel) {
        QEvent event(QEvent::WindowActivate);
        q->sendEvent(panel, &event);

        // Set focus on the panel's focus item, or itself if it's
        // focusable, or on the first focusable item in the panel's
        // focus chain as a last resort.
        if (QGraphicsItem *focusItem = panel->focusItem()) {
            setFocusItemHelper(focusItem, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->flags() & QGraphicsItem::ItemIsFocusable) {
            setFocusItemHelper(panel, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->isWidget()) {
            QGraphicsWidget *fw = static_cast<QGraphicsWidget *>(panel)->d_func()->focusNext;
            do {
                if (fw->focusPolicy() & Qt::TabFocus) {
                    setFocusItemHelper(fw, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
                    break;
                }
                fw = fw->d_func()->focusNext;
            } while (fw != panel);
        }
    } else if (q->isActive()) {
        const auto items = q->items();
        // Activate the scene
        QEvent event(QEvent::WindowActivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    emit q->focusItemChanged(focusItem, oldFocusItem, Qt::ActiveWindowFocusReason);
}